

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Parse(lemon *gp)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  FILE *__stream;
  ulong uVar6;
  char *filebuf_00;
  size_t sVar7;
  ushort **ppuVar8;
  int iVar9;
  bool bVar10;
  bool local_3f73;
  bool local_3f71;
  bool local_3f6f;
  bool local_3f6c;
  bool local_3f6a;
  int prevc_1;
  int startchar;
  int prevc;
  int level;
  int startline;
  char *nextcp;
  char *cp;
  int local_3f38;
  int c;
  int lineno;
  int filesize;
  char *filebuf;
  FILE *fp;
  pstate ps;
  lemon *gp_local;
  
  ps.lastrule = (rule *)gp;
  memset(&fp,0,0x3f10);
  ps.tokenstart = (char *)ps.lastrule;
  fp = (FILE *)ps.lastrule[1].codePrefix;
  ps.filename._4_4_ = 0;
  ps.gp._0_4_ = 0;
  __stream = fopen((char *)fp,"rb");
  if (__stream == (FILE *)0x0) {
    ErrorMsg((char *)fp,0,"Can\'t open this file for reading.");
    *(int *)&(ps.lastrule)->code = *(int *)&(ps.lastrule)->code + 1;
  }
  else {
    fseek(__stream,0,2);
    uVar6 = ftell(__stream);
    iVar5 = (int)uVar6;
    rewind(__stream);
    filebuf_00 = (char *)malloc((long)(iVar5 + 1));
    if ((iVar5 < 0x5f5e101) && (filebuf_00 != (char *)0x0)) {
      sVar7 = fread(filebuf_00,1,(long)iVar5,__stream);
      if (sVar7 == (long)iVar5) {
        fclose(__stream);
        iVar5 = strip_crlf(filebuf_00,iVar5);
        filebuf_00[iVar5] = '\0';
        preprocess_input(filebuf_00);
        local_3f38 = 1;
        nextcp = filebuf_00;
        while (bVar1 = *nextcp, bVar1 != 0) {
          if (bVar1 == 10) {
            local_3f38 = local_3f38 + 1;
          }
          iVar5 = local_3f38;
          ppuVar8 = __ctype_b_loc();
          if (((*ppuVar8)[(int)(uint)bVar1] & 0x2000) == 0) {
            if ((bVar1 == 0x2f) && (nextcp[1] == '/')) {
              for (nextcp = nextcp + 2; *nextcp != '\0' && *nextcp != '\n'; nextcp = nextcp + 1) {
              }
            }
            else if ((bVar1 == 0x2f) && (nextcp[1] == '*')) {
              nextcp = nextcp + 2;
              while( true ) {
                cVar2 = *nextcp;
                bVar10 = false;
                if ((cVar2 != '\0') && (bVar10 = true, cVar2 == '/')) {
                  bVar10 = nextcp[-1] != '*';
                }
                if (!bVar10) break;
                if (cVar2 == '\n') {
                  local_3f38 = local_3f38 + 1;
                }
                nextcp = nextcp + 1;
              }
              if (cVar2 != '\0') {
                nextcp = nextcp + 1;
              }
            }
            else {
              ps._8_8_ = nextcp;
              ps.filename._0_4_ = local_3f38;
              _level = nextcp;
              if (bVar1 == 0x22) {
                while( true ) {
                  nextcp = _level + 1;
                  cVar2 = *nextcp;
                  if (cVar2 == '\0' || cVar2 == '\"') break;
                  _level = nextcp;
                  if (cVar2 == '\n') {
                    local_3f38 = local_3f38 + 1;
                  }
                }
                if (cVar2 == '\0') {
                  ErrorMsg((char *)fp,0,
                           "String starting on this line is not terminated before the end of the file."
                          );
                  ps.filename._4_4_ = ps.filename._4_4_ + 1;
                  _level = nextcp;
                }
                else {
                  _level = _level + 2;
                }
              }
              else if (bVar1 == 0x7b) {
                startchar = 1;
                while( true ) {
                  _level = nextcp;
                  nextcp = _level + 1;
                  cVar2 = *nextcp;
                  local_3f6a = false;
                  if (cVar2 != '\0') {
                    local_3f6a = 1 < startchar || cVar2 != '}';
                  }
                  if (!local_3f6a) break;
                  if (cVar2 == '\n') {
                    local_3f38 = local_3f38 + 1;
                  }
                  else if (cVar2 == '{') {
                    startchar = startchar + 1;
                  }
                  else if (cVar2 == '}') {
                    startchar = startchar + -1;
                  }
                  else if ((cVar2 == '/') && (_level[2] == '*')) {
                    nextcp = _level + 3;
                    prevc_1 = 0;
                    while( true ) {
                      iVar9 = (int)*nextcp;
                      local_3f6c = false;
                      if (iVar9 != 0) {
                        local_3f6c = iVar9 != 0x2f || prevc_1 != 0x2a;
                      }
                      if (!local_3f6c) break;
                      if (iVar9 == 10) {
                        local_3f38 = local_3f38 + 1;
                      }
                      nextcp = nextcp + 1;
                      prevc_1 = iVar9;
                    }
                  }
                  else if ((cVar2 == '/') && (_level[2] == '/')) {
                    for (nextcp = _level + 3; cVar2 = *nextcp, cVar2 != '\0' && cVar2 != '\n';
                        nextcp = nextcp + 1) {
                    }
                    if (cVar2 != '\0') {
                      local_3f38 = local_3f38 + 1;
                    }
                  }
                  else if ((cVar2 == '\'') || (cVar2 == '\"')) {
                    nextcp = _level + 2;
                    cVar4 = '\0';
                    while( true ) {
                      cVar3 = *nextcp;
                      local_3f6f = false;
                      if (cVar3 != '\0') {
                        local_3f6f = cVar3 != cVar2 || cVar4 == '\\';
                      }
                      if (!local_3f6f) break;
                      if (cVar3 == '\n') {
                        local_3f38 = local_3f38 + 1;
                      }
                      if (cVar4 == '\\') {
                        cVar3 = '\0';
                      }
                      nextcp = nextcp + 1;
                      cVar4 = cVar3;
                    }
                  }
                }
                if (cVar2 == '\0') {
                  ErrorMsg((char *)fp,iVar5,
                           "C code starting on this line is not terminated before the end of the file."
                          );
                  ps.filename._4_4_ = ps.filename._4_4_ + 1;
                  _level = nextcp;
                }
                else {
                  _level = _level + 2;
                }
              }
              else {
                ppuVar8 = __ctype_b_loc();
                if (((*ppuVar8)[(int)(uint)bVar1] & 8) == 0) {
                  if (((bVar1 == 0x3a) && (nextcp[1] == ':')) && (nextcp[2] == '=')) {
                    _level = nextcp + 3;
                    nextcp = _level;
                  }
                  else if (((bVar1 == 0x2f) || (bVar1 == 0x7c)) &&
                          (ppuVar8 = __ctype_b_loc(),
                          ((*ppuVar8)[(int)(uint)(byte)nextcp[1]] & 0x400) != 0)) {
                    nextcp = nextcp + 2;
                    while( true ) {
                      bVar1 = *nextcp;
                      local_3f73 = false;
                      if (bVar1 != 0) {
                        ppuVar8 = __ctype_b_loc();
                        local_3f73 = ((*ppuVar8)[(int)(uint)bVar1] & 8) != 0 || bVar1 == 0x5f;
                      }
                      _level = nextcp;
                      if (!local_3f73) break;
                      nextcp = nextcp + 1;
                    }
                  }
                  else {
                    _level = nextcp + 1;
                    nextcp = _level;
                  }
                }
                else {
                  while( true ) {
                    bVar1 = *nextcp;
                    local_3f71 = false;
                    if (bVar1 != 0) {
                      ppuVar8 = __ctype_b_loc();
                      local_3f71 = ((*ppuVar8)[(int)(uint)bVar1] & 8) != 0 || bVar1 == 0x5f;
                    }
                    _level = nextcp;
                    if (!local_3f71) break;
                    nextcp = nextcp + 1;
                  }
                }
              }
              cVar2 = *nextcp;
              *nextcp = '\0';
              parseonetoken((pstate *)&fp);
              *nextcp = cVar2;
              nextcp = _level;
            }
          }
          else {
            nextcp = nextcp + 1;
          }
        }
        free(filebuf_00);
        (ps.lastrule)->lhsalias = (char *)ps._16120_8_;
        *(int *)&(ps.lastrule)->code = ps.filename._4_4_;
      }
      else {
        ErrorMsg((char *)fp,0,"Can\'t read in all %d bytes of this file.",uVar6 & 0xffffffff);
        free(filebuf_00);
        *(int *)&(ps.lastrule)->code = *(int *)&(ps.lastrule)->code + 1;
        fclose(__stream);
      }
    }
    else {
      ErrorMsg((char *)fp,0,"Input file too large.");
      *(int *)&(ps.lastrule)->code = *(int *)&(ps.lastrule)->code + 1;
      fclose(__stream);
    }
  }
  return;
}

Assistant:

void Parse(struct lemon *gp)
{
  struct pstate ps;
  FILE *fp;
  char *filebuf;
  int filesize;
  int lineno;
  int c;
  char *cp, *nextcp;
  int startline = 0;

  memset(&ps, '\0', sizeof(ps));
  ps.gp = gp;
  ps.filename = gp->filename;
  ps.errorcnt = 0;
  ps.state = INITIALIZE;

  /* Begin by reading the input file */
  fp = fopen(ps.filename,"rb");
  if( fp==0 ){
    ErrorMsg(ps.filename,0,"Can't open this file for reading.");
    gp->errorcnt++;
    return;
  }
  fseek(fp,0,2);
  filesize = ftell(fp);
  rewind(fp);
  filebuf = (char *)malloc( filesize+1 );
  if( filesize>100000000 || filebuf==0 ){
    ErrorMsg(ps.filename,0,"Input file too large.");
    gp->errorcnt++;
    fclose(fp);
    return;
  }
  if( fread(filebuf,1,filesize,fp)!=filesize ){
    ErrorMsg(ps.filename,0,"Can't read in all %d bytes of this file.",
      filesize);
    free(filebuf);
    gp->errorcnt++;
    fclose(fp);
    return;
  }
  fclose(fp);
  filesize = strip_crlf(filebuf, filesize);
  filebuf[filesize] = 0;

  /* Make an initial pass through the file to handle %ifdef and %ifndef */
  preprocess_input(filebuf);

  /* Now scan the text of the input file */
  lineno = 1;
  for(cp=filebuf; (c= *cp)!=0; ){
    if( c=='\n' ) lineno++;              /* Keep track of the line number */
    if( ISSPACE(c) ){ cp++; continue; }  /* Skip all white space */
    if( c=='/' && cp[1]=='/' ){          /* Skip C++ style comments */
      cp+=2;
      while( (c= *cp)!=0 && c!='\n' ) cp++;
      continue;
    }
    if( c=='/' && cp[1]=='*' ){          /* Skip C style comments */
      cp+=2;
      while( (c= *cp)!=0 && (c!='/' || cp[-1]!='*') ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c ) cp++;
      continue;
    }
    ps.tokenstart = cp;                /* Mark the beginning of the token */
    ps.tokenlineno = lineno;           /* Linenumber on which token begins */
    if( c=='\"' ){                     /* String literals */
      cp++;
      while( (c= *cp)!=0 && c!='\"' ){
        if( c=='\n' ) lineno++;
        cp++;
      }
      if( c==0 ){
        ErrorMsg(ps.filename,startline,
"String starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( c=='{' ){               /* A block of C code */
      int level;
      cp++;
      for(level=1; (c= *cp)!=0 && (level>1 || c!='}'); cp++){
        if( c=='\n' ) lineno++;
        else if( c=='{' ) level++;
        else if( c=='}' ) level--;
        else if( c=='/' && cp[1]=='*' ){  /* Skip comments */
          int prevc;
          cp = &cp[2];
          prevc = 0;
          while( (c= *cp)!=0 && (c!='/' || prevc!='*') ){
            if( c=='\n' ) lineno++;
            prevc = c;
            cp++;
	  }
	}else if( c=='/' && cp[1]=='/' ){  /* Skip C++ style comments too */
          cp = &cp[2];
          while( (c= *cp)!=0 && c!='\n' ) cp++;
          if( c ) lineno++;
	}else if( c=='\'' || c=='\"' ){    /* String a character literals */
          int startchar, prevc;
          startchar = c;
          prevc = 0;
          for(cp++; (c= *cp)!=0 && (c!=startchar || prevc=='\\'); cp++){
            if( c=='\n' ) lineno++;
            if( prevc=='\\' ) prevc = 0;
            else              prevc = c;
	  }
	}
      }
      if( c==0 ){
        ErrorMsg(ps.filename,ps.tokenlineno,
"C code starting on this line is not terminated before the end of the file.");
        ps.errorcnt++;
        nextcp = cp;
      }else{
        nextcp = cp+1;
      }
    }else if( ISALNUM(c) ){          /* Identifiers */
      while( (c= *cp)!=0 && (ISALNUM(c) || c=='_') ) cp++;
      nextcp = cp;
    }else if( c==':' && cp[1]==':' && cp[2]=='=' ){ /* The operator "::=" */
      cp += 3;
      nextcp = cp;
    }else if( (c=='/' || c=='|') && ISALPHA(cp[1]) ){
      cp += 2;
      while( (c = *cp)!=0 && (ISALNUM(c) || c=='_') ) cp++;
      nextcp = cp;
    }else{                          /* All other (one character) operators */
      cp++;
      nextcp = cp;
    }
    c = *cp;
    *cp = 0;                        /* Null terminate the token */
    parseonetoken(&ps);             /* Parse the token */
    *cp = c;                        /* Restore the buffer */
    cp = nextcp;
  }
  free(filebuf);                    /* Release the buffer after parsing */
  gp->rule = ps.firstrule;
  gp->errorcnt = ps.errorcnt;
}